

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

WebPMuxError MuxImageDeleteNth(WebPMuxImage **wpi_list,uint32_t nth)

{
  WebPMuxImage **ppWVar1;
  int iVar2;
  WebPMuxImage *pWVar3;
  WebPMuxImage **wpi_list_local;
  
  wpi_list_local = wpi_list;
  iVar2 = SearchImageToGetOrDelete(wpi_list,nth,&wpi_list_local);
  ppWVar1 = wpi_list_local;
  if (iVar2 != 0) {
    pWVar3 = MuxImageDelete(*wpi_list_local);
    *ppWVar1 = pWVar3;
  }
  return (uint)(iVar2 != 0);
}

Assistant:

WebPMuxError MuxImageDeleteNth(WebPMuxImage** wpi_list, uint32_t nth) {
  assert(wpi_list);
  if (!SearchImageToGetOrDelete(wpi_list, nth, &wpi_list)) {
    return WEBP_MUX_NOT_FOUND;
  }
  *wpi_list = MuxImageDelete(*wpi_list);
  return WEBP_MUX_OK;
}